

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sLongShaderTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Stress::LongShaderCompileStressCase::iterate(LongShaderCompileStressCase *this)

{
  string *psVar1;
  LongShaderGenerator *this_00;
  NameGenerator *this_01;
  vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *this_02;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_03;
  int *piVar2;
  _Rb_tree_header *this_04;
  ShaderType SVar3;
  uint uVar4;
  TestLog *log;
  pointer psVar5;
  const_iterator __last;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  char __rhs;
  _Base_ptr p_Var6;
  pointer in_RCX;
  size_t siglen;
  int iVar7;
  int precision;
  uint uVar8;
  uchar *sig;
  uint numItems;
  uint uVar9;
  deUint32 dVar10;
  deUint32 dVar11;
  char *pcVar12;
  uchar *in_R8;
  size_t in_R9;
  int ndx;
  int iVar13;
  _Self __tmp;
  float val;
  string varName;
  string expr;
  string varName_1;
  string outName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  inNames;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ShaderScope scope;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  undefined1 local_148 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  ProgramSources sources;
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  SVar3 = this->m_shaderType;
  memset(&sources,0,0xac);
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  sources._193_8_ = 0;
  psVar1 = &(this->m_gen).m_source;
  if ((this->m_gen).m_source._M_string_length == 0) {
    *(psVar1->_M_dataplus)._M_p = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&scope,"#version 300 es",(allocator<char> *)&varName);
    this_00 = &this->m_gen;
    Stress::anon_unknown_0::LongShaderGenerator::addLine(this_00,(string *)&scope);
    std::__cxx11::string::~string((string *)&scope);
    if ((this->m_gen).m_spec.shaderType == SHADERTYPE_FRAGMENT) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&scope,"layout(location = 0) out mediump vec4 o_fragColor;",
                 (allocator<char> *)&varName);
      Stress::anon_unknown_0::LongShaderGenerator::addLine(this_00,(string *)&scope);
      std::__cxx11::string::~string((string *)&scope);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&scope,"void main (void)",(allocator<char> *)&varName);
    Stress::anon_unknown_0::LongShaderGenerator::addLine(this_00,(string *)&scope);
    std::__cxx11::string::~string((string *)&scope);
    scope._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &scope._M_t._M_impl.super__Rb_tree_header._M_header;
    scope._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    scope._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    scope._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    scope._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         scope._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&varName,"{",(allocator<char> *)&varName_1);
    Stress::anon_unknown_0::LongShaderGenerator::addLine(this_00,&varName);
    std::__cxx11::string::~string((string *)&varName);
    this_01 = &(this->m_gen).m_nameGen;
    iVar13 = (this->m_gen).m_nameGen.m_currentScopeDepth;
    iVar7 = iVar13 + 1;
    (this->m_gen).m_nameGen.m_currentScopeDepth = iVar7;
    in_RCX = (pointer)(this->m_gen).m_nameGen.m_scopeIndices.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start;
    if ((ulong)((long)(this->m_gen).m_nameGen.m_scopeIndices.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_finish - (long)in_RCX >> 2) < (ulong)(long)iVar7) {
      varName._M_dataplus._M_p = varName._M_dataplus._M_p & 0xffffffff00000000;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                (&this_01->m_scopeIndices,(int *)&varName);
    }
    else {
      piVar2 = (int *)((long)&(in_RCX->_M_dataplus)._M_p + (long)iVar13 * 4);
      *piVar2 = *piVar2 + 1;
    }
    piVar2 = &(this->m_gen).m_nameGen.m_variableIndex;
    (this->m_gen).m_nameGen.m_variableIndex = 0;
    dVar11 = (this->m_gen).m_spec.variablesPerBlock;
    for (dVar10 = 0; dVar10 != dVar11; dVar10 = dVar10 + 1) {
      *piVar2 = *piVar2 + 1;
      varName._M_dataplus._M_p = (pointer)&varName.field_2;
      varName._M_string_length = 0;
      varName.field_2._M_local_buf[0] = '\0';
      for (iVar13 = 0; iVar13 < (this->m_gen).m_nameGen.m_currentScopeDepth; iVar13 = iVar13 + 1) {
        in_RCX = (pointer)(this_01->m_scopeIndices).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::push_back((char)&varName);
      }
      de::toString<int>(&varName_1,piVar2);
      std::operator+(&local_258,&varName,&varName_1);
      std::__cxx11::string::~string((string *)&varName_1);
      std::__cxx11::string::~string((string *)&varName);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&scope,&local_258);
      std::__cxx11::string::~string((string *)&local_258);
    }
    this_02 = &(this->m_gen).m_scopes;
    std::
    vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::push_back(this_02,&scope);
    this_03 = &(this->m_gen).m_varNames;
    for (p_Var6 = scope._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &scope._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      std::__cxx11::string::string((string *)&varName,(string *)(p_Var6 + 1));
      val = deRandom_getFloat((deRandom *)this_00);
      std::operator+(&local_120,"mediump float ",&varName);
      std::operator+(&local_168,&local_120," = ");
      de::floatToString_abi_cxx11_(&outName,(de *)0x5,val,precision);
      std::operator+(&local_258,&local_168,&outName);
      std::operator+(&varName_1,&local_258,"f;");
      Stress::anon_unknown_0::LongShaderGenerator::addLine(this_00,&varName_1);
      std::__cxx11::string::~string((string *)&varName_1);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&outName);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_120);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_03,&varName);
      std::__cxx11::string::~string((string *)&varName);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&scope._M_t);
    uVar9 = 0;
    while( true ) {
      uVar4 = (this->m_gen).m_spec.opsTotal;
      dVar11 = uVar4 - uVar9;
      if (uVar4 < uVar9 || dVar11 == 0) break;
      dVar10 = (this->m_gen).m_spec.opsPerExpression;
      uVar8 = uVar9 + dVar10;
      if (uVar8 < uVar4) {
        de::Random::
        choose<std::__cxx11::string,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  (&outName,&this_00->m_rnd,
                   (this->m_gen).m_varNames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (this->m_gen).m_varNames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        dVar11 = dVar10;
      }
      else {
        pcVar12 = "o_fragColor";
        if ((this->m_gen).m_spec.shaderType == SHADERTYPE_VERTEX) {
          pcVar12 = "gl_Position";
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&outName,pcVar12,(allocator<char> *)&scope);
      }
      numItems = dVar11 + 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&inNames,(long)(int)numItems,(allocator_type *)&scope);
      in_R8 = (uchar *)(ulong)numItems;
      in_RCX = inNames.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      de::Random::
      choose<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                (&this_00->m_rnd,
                 (this->m_gen).m_varNames.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (this->m_gen).m_varNames.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )inNames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,numItems);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&scope,"+-*/",(allocator<char> *)&varName);
      expr._M_dataplus._M_p = (pointer)&expr.field_2;
      expr._M_string_length = 0;
      expr.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::_M_assign((string *)&expr);
      for (iVar13 = 1; iVar13 <= (int)dVar11; iVar13 = iVar13 + 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&varName_1,glcts::fixed_sample_locations_values + 1,
                   (allocator<char> *)&local_258);
        first._M_current._4_4_ = scope._M_t._M_impl._4_4_;
        first._M_current._0_4_ = scope._M_t._M_impl._0_4_;
        __rhs = de::Random::
                choose<char,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                          (&this_00->m_rnd,first,
                           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(first._M_current +
                             CONCAT44(scope._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                                      scope._M_t._M_impl.super__Rb_tree_header._M_header._M_color)))
        ;
        std::operator+(&varName,&varName_1,__rhs);
        std::__cxx11::string::~string((string *)&varName_1);
        std::__cxx11::string::string
                  ((string *)&varName_1,
                   (string *)
                   (inNames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + iVar13));
        std::operator+(&local_120," ",&varName);
        std::operator+(&local_168,&local_120," ");
        std::operator+(&local_258,&local_168,&varName_1);
        std::__cxx11::string::append((string *)&expr);
        std::__cxx11::string::~string((string *)&local_258);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&varName_1);
        std::__cxx11::string::~string((string *)&varName);
      }
      std::__cxx11::string::~string((string *)&scope);
      if (uVar8 < uVar4) {
        std::operator+(&varName_1,&outName," = ");
        std::operator+(&varName,&varName_1,&expr);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&scope,
                       &varName,";");
        Stress::anon_unknown_0::LongShaderGenerator::addLine
                  (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &scope);
      }
      else {
        std::operator+(&varName_1,&outName," = vec4(");
        std::operator+(&varName,&varName_1,&expr);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&scope,
                       &varName,");");
        Stress::anon_unknown_0::LongShaderGenerator::addLine
                  (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &scope);
      }
      std::__cxx11::string::~string((string *)&scope);
      std::__cxx11::string::~string((string *)&varName);
      std::__cxx11::string::~string((string *)&varName_1);
      std::__cxx11::string::~string((string *)&expr);
      uVar9 = dVar11 + uVar9;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&inNames);
      std::__cxx11::string::~string((string *)&outName);
    }
    while (psVar5 = (this->m_gen).m_scopes.
                    super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
          (this->m_gen).m_scopes.
          super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != psVar5) {
      in_RCX = (this->m_gen).m_varNames.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __last._M_current =
           (this->m_gen).m_varNames.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase(this_03,in_RCX + (((ulong)((long)__last._M_current - (long)in_RCX) >> 5) -
                               psVar5[-1]._M_t._M_impl.super__Rb_tree_header._M_node_count),__last);
      piVar2 = &(this->m_gen).m_nameGen.m_currentScopeDepth;
      *piVar2 = *piVar2 + -1;
      std::
      vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::pop_back(this_02);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&scope,"}",(allocator<char> *)&varName);
      Stress::anon_unknown_0::LongShaderGenerator::addLine(this_00,(string *)&scope);
      std::__cxx11::string::~string((string *)&scope);
    }
  }
  local_148._0_4_ = (this->m_gen).m_spec.shaderType;
  std::__cxx11::string::string((string *)(local_148 + 8),(string *)psVar1);
  glu::ProgramSources::operator<<(&sources,(ShaderSource *)local_148);
  std::__cxx11::string::~string((string *)(local_148 + 8));
  pcVar12 = "#version 300 es\nvoid main ()\n{\n\tgl_Position = vec4(0.0);\n}\n";
  if (SVar3 == SHADERTYPE_VERTEX) {
    pcVar12 = 
    "#version 300 es\nlayout(location = 0) out mediump vec4 o_fragColor;\nvoid main ()\n{\n\to_fragColor = vec4(0.0);\n}\n"
    ;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_148,pcVar12,(allocator<char> *)&varName);
  siglen = CONCAT71((int7)((ulong)in_RCX >> 8),SVar3 == SHADERTYPE_VERTEX);
  this_04 = &scope._M_t._M_impl.super__Rb_tree_header;
  scope._M_t._M_impl._0_4_ = ZEXT14(SVar3 == SHADERTYPE_VERTEX);
  std::__cxx11::string::string((string *)this_04,(string *)local_148);
  glu::ProgramSources::operator<<(&sources,(ShaderSource *)&scope);
  std::__cxx11::string::~string((string *)this_04);
  std::__cxx11::string::~string((string *)local_148);
  glu::ShaderProgram::ShaderProgram
            ((ShaderProgram *)&scope,((this->super_TestCase).m_context)->m_renderCtx,&sources);
  verify(this,(EVP_PKEY_CTX *)&scope,sig,siglen,in_R8,in_R9);
  glu::operator<<(log,(ShaderProgram *)&scope);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)&scope);
  glu::ProgramSources::~ProgramSources(&sources);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult LongShaderCompileStressCase::iterate (void)
{
	tcu::TestLog&				log			= m_testCtx.getLog();
	const glu::ShaderType		otherShader	= (m_shaderType == glu::SHADERTYPE_VERTEX) ? glu::SHADERTYPE_FRAGMENT : glu::SHADERTYPE_VERTEX;
	glu::ProgramSources			sources;

	sources << m_gen.getSource();
	sources << glu::ShaderSource(otherShader, getConstShaderSource(otherShader));

	{
		glu::ShaderProgram program(m_context.getRenderContext(), sources);

		verify(program);

		log << program;
	}

	return STOP;
}